

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O0

bool __thiscall tinyusdz::StreamReader::read1(StreamReader *this,char *ret)

{
  bool bVar1;
  char val;
  char *ret_local;
  StreamReader *this_local;
  
  bVar1 = this->idx_ + 1 <= this->length_;
  if (bVar1) {
    *ret = this->binary_[this->idx_];
    this->idx_ = this->idx_ + 1;
  }
  return bVar1;
}

Assistant:

bool read1(char *ret) const {
    if ((idx_ + 1) > length_) {
      return false;
    }

    const char val = static_cast<const char>(binary_[idx_]);

    (*ret) = val;
    idx_ += 1;

    return true;
  }